

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O1

void X509_OBJECT_free_contents(X509_OBJECT *a)

{
  if (a->type == 2) {
    X509_CRL_free((a->data).crl);
  }
  else if (a->type == 1) {
    X509_free((a->data).x509);
  }
  *(undefined8 *)a = 0;
  (a->data).ptr = (char *)0x0;
  return;
}

Assistant:

void X509_OBJECT_free_contents(X509_OBJECT *a) {
  switch (a->type) {
    case X509_LU_X509:
      X509_free(a->data.x509);
      break;
    case X509_LU_CRL:
      X509_CRL_free(a->data.crl);
      break;
  }

  OPENSSL_memset(a, 0, sizeof(X509_OBJECT));
}